

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Bytes __thiscall Omega_h::mark_fan_preimage(Omega_h *this,LOs *a2b)

{
  void *extraout_RDX;
  Bytes BVar1;
  Write<signed_char> local_e8;
  undefined1 local_d8 [8];
  type f;
  allocator local_a1;
  string local_a0 [32];
  undefined1 local_80 [8];
  Write<signed_char> out;
  LOs *a2b_local;
  ulong local_30;
  ulong local_20;
  LO local_10;
  
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  out.shared_alloc_.direct_ptr = a2b;
  if (0 < (int)(local_20 >> 2)) {
    if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
      local_30 = ((a2b->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_30 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"",&local_a1);
    Write<signed_char>::Write
              ((Write<signed_char> *)local_80,(int)(local_30 >> 2) + -1,(string *)local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    Write<signed_char>::Write((Write<signed_char> *)local_d8,(Write<signed_char> *)local_80);
    Read<int>::Read((Read<int> *)&f.out.shared_alloc_.direct_ptr,a2b);
    if (((ulong)local_80 & 1) == 0) {
      local_10 = (LO)*(size_t *)local_80;
    }
    else {
      local_10 = (LO)((ulong)local_80 >> 3);
    }
    parallel_for<Omega_h::mark_fan_preimage(Omega_h::Read<int>)::__0&>(local_10,(type *)local_d8);
    Write<signed_char>::Write(&local_e8,(Write<signed_char> *)local_80);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_e8);
    Write<signed_char>::~Write(&local_e8);
    mark_fan_preimage(Omega_h::Read<int>)::$_0::~__0((__0 *)local_d8);
    Write<signed_char>::~Write((Write<signed_char> *)local_80);
    BVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    BVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Bytes)BVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a2b.size() >= 1",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x11b);
}

Assistant:

Bytes mark_fan_preimage(LOs a2b) {
  OMEGA_H_CHECK(a2b.size() >= 1);
  auto out = Write<Byte>(a2b.size() - 1);
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = (a2b[i] != a2b[i + 1]); };
  parallel_for(out.size(), f);
  return out;
}